

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O2

void __thiscall
capnp::BufferedMessageStream::BufferedMessageStream
          (BufferedMessageStream *this,AsyncCapabilityStream *stream,
          IsShortLivedCallback *isShortLivedCallback,size_t bufferSizeInWords)

{
  word *pwVar1;
  Iface *pIVar2;
  
  (this->super_MessageStream)._vptr_MessageStream = (_func_int **)&PTR_tryReadMessage_006614f0;
  this->stream = &stream->super_AsyncIoStream;
  (this->capStream).ptr = stream;
  pIVar2 = (isShortLivedCallback->impl).ptr;
  (this->isShortLivedCallback).impl.disposer = (isShortLivedCallback->impl).disposer;
  (this->isShortLivedCallback).impl.ptr = pIVar2;
  (isShortLivedCallback->impl).ptr = (Iface *)0x0;
  kj::heapArray<capnp::word>(&this->buffer,bufferSizeInWords);
  pwVar1 = (this->buffer).ptr;
  this->beginData = pwVar1;
  this->beginAvailable = (byte *)pwVar1;
  (this->leftoverFds).builder.endPtr = (OwnFd *)0x0;
  (this->leftoverFds).builder.ptr = (OwnFd *)0x0;
  (this->leftoverFds).builder.pos = (RemoveConst<kj::OwnFd> *)0x0;
  (this->leftoverFds).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  this->hasOutstandingShortLivedMessage = false;
  return;
}

Assistant:

BufferedMessageStream::BufferedMessageStream(
    kj::AsyncCapabilityStream& stream, IsShortLivedCallback isShortLivedCallback,
    size_t bufferSizeInWords)
    : stream(stream), capStream(stream), isShortLivedCallback(kj::mv(isShortLivedCallback)),
      buffer(kj::heapArray<word>(bufferSizeInWords)),
      beginData(buffer.begin()), beginAvailable(buffer.asBytes().begin()) {}